

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSslError>::emplace<QSslError_const&>
          (QMovableArrayOps<QSslError> *this,qsizetype i,QSslError *args)

{
  QSslError **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QSslError tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size == i) {
      qVar5 = QArrayDataPointer<QSslError>::freeSpaceAtEnd((QArrayDataPointer<QSslError> *)this);
      if (qVar5 == 0) goto LAB_0022e5a2;
      QSslError::QSslError
                ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr +
                 (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size,
                 args);
LAB_0022e687:
      pqVar2 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0022e646;
    }
LAB_0022e5a2:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QSslError>::freeSpaceAtBegin((QArrayDataPointer<QSslError> *)this);
      if (qVar5 != 0) {
        QSslError::QSslError
                  ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr
                   + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0022e687;
      }
    }
  }
  tmp.d._M_t.super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
  super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl =
       (unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
  QSslError::QSslError(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size != 0;
  QArrayDataPointer<QSslError>::detachAndGrow
            ((QArrayDataPointer<QSslError> *)this,(uint)(i == 0 && bVar6),1,(QSslError **)0x0,
             (QArrayDataPointer<QSslError> *)0x0);
  if (i == 0 && bVar6) {
    QSslError::QSslError
              ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr + -1
               ,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QSslError> *)this,i,1);
    QSslError::QSslError(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QSslError::~QSslError(&tmp);
LAB_0022e646:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }